

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiFeatureInfo.cpp
# Opt level: O2

TestStatus *
vkt::api::anon_unknown_0::android::testNoLayers(TestStatus *__return_storage_ptr__,Context *context)

{
  TestLog *log;
  Context *this;
  TestStatus *pTVar1;
  qpTestResult qVar2;
  InstanceInterface *vki;
  VkPhysicalDevice physicalDevice;
  pointer pVVar3;
  vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_> layers;
  ResultCollector results;
  allocator<char> local_e9;
  _Vector_base<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_> local_e8;
  Context *local_d0;
  string local_c8;
  TestStatus *local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  undefined1 local_80 [80];
  
  log = context->m_testCtx->m_log;
  local_d0 = context;
  local_a8 = __return_storage_ptr__;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,"",(allocator<char> *)&local_a0);
  tcu::ResultCollector::ResultCollector((ResultCollector *)local_80,log,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  ::vk::enumerateInstanceLayerProperties
            ((vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_> *)&local_e8,
             local_d0->m_platformInterface);
  for (pVVar3 = local_e8._M_impl.super__Vector_impl_data._M_start;
      pVVar3 != local_e8._M_impl.super__Vector_impl_data._M_finish; pVVar3 = pVVar3 + 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,"Instance layer enumerated: ",&local_e9);
    std::operator+(&local_c8,&local_a0,pVVar3->layerName);
    tcu::ResultCollector::fail((ResultCollector *)local_80,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_a0);
  }
  std::_Vector_base<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>::~_Vector_base
            (&local_e8);
  this = local_d0;
  vki = Context::getInstanceInterface(local_d0);
  physicalDevice = Context::getPhysicalDevice(this);
  ::vk::enumerateDeviceLayerProperties
            ((vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_> *)&local_e8,vki,
             physicalDevice);
  for (pVVar3 = local_e8._M_impl.super__Vector_impl_data._M_start;
      pVVar3 != local_e8._M_impl.super__Vector_impl_data._M_finish; pVVar3 = pVVar3 + 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,"Device layer enumerated: ",&local_e9);
    std::operator+(&local_c8,&local_a0,pVVar3->layerName);
    tcu::ResultCollector::fail((ResultCollector *)local_80,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_a0);
  }
  std::_Vector_base<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>::~_Vector_base
            (&local_e8);
  qVar2 = tcu::ResultCollector::getResult((ResultCollector *)local_80);
  std::__cxx11::string::string((string *)&local_c8,(string *)(local_80 + 0x30));
  pTVar1 = local_a8;
  local_a8->m_code = qVar2;
  std::__cxx11::string::string((string *)&local_a8->m_description,(string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  tcu::ResultCollector::~ResultCollector((ResultCollector *)local_80);
  return pTVar1;
}

Assistant:

tcu::TestStatus testNoLayers (Context& context)
{
	TestLog&				log		= context.getTestContext().getLog();
	tcu::ResultCollector	results	(log);

	{
		const vector<VkLayerProperties>	layers	= enumerateInstanceLayerProperties(context.getPlatformInterface());

		for (vector<VkLayerProperties>::const_iterator layer = layers.begin(); layer != layers.end(); ++layer)
			results.fail(string("Instance layer enumerated: ") + layer->layerName);
	}

	{
		const vector<VkLayerProperties>	layers	= enumerateDeviceLayerProperties(context.getInstanceInterface(), context.getPhysicalDevice());

		for (vector<VkLayerProperties>::const_iterator layer = layers.begin(); layer != layers.end(); ++layer)
			results.fail(string("Device layer enumerated: ") + layer->layerName);
	}

	return tcu::TestStatus(results.getResult(), results.getMessage());
}